

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,SchnorrPubkey *pubkey)

{
  allocator local_41;
  string local_40;
  SchnorrPubkey *local_20;
  SchnorrPubkey *pubkey_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_20 = pubkey;
  pubkey_local._0_4_ = witness_ver;
  pubkey_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"",&local_41);
  Address(this,type,witness_ver,pubkey,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey)
    : Address(type, witness_ver, pubkey, "") {
  // do nothing
}